

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

void display_message(game_event_type unused,game_event_data *data,void *user)

{
  undefined1 uVar1;
  char *__s;
  wchar_t wVar2;
  size_t sVar3;
  int iVar4;
  wchar_t local_474;
  wchar_t local_46c;
  wchar_t local_468;
  wchar_t local_458;
  wchar_t wStack_454;
  char oops;
  wchar_t check;
  wchar_t split;
  char *msg;
  wchar_t type;
  wchar_t h;
  wchar_t w;
  uint8_t color;
  char buf [1024];
  wchar_t *local_30;
  char *t;
  wchar_t n;
  void *user_local;
  game_event_data *data_local;
  game_event_type unused_local;
  
  if (data != (game_event_data *)0x0) {
    msg._0_4_ = (data->message).type;
    __s = data->string;
    if ((Term == (term *)0x0) || ((wchar_t)msg != L'\x1a')) {
      if ((__s != (char *)0x0) && ((Term != (term *)0x0 && (character_generated)))) {
        Term_get_size(&type,(int *)((long)&msg + 4));
        if ((msg_flag & 1U) == 0) {
          message_column = L'\0';
        }
        if (__s == (char *)0x0) {
          local_468 = L'\0';
        }
        else {
          sVar3 = strlen(__s);
          local_468 = (wchar_t)sVar3;
        }
        t._4_4_ = local_468;
        if ((message_column != L'\0') &&
           ((__s == (char *)0x0 || (type + L'\xfffffff8' < message_column + local_468)))) {
          if (type + L'\xfffffff8' < message_column) {
            msg_flush_split_existing(type,&message_column);
          }
          else {
            msg_flush(message_column);
            message_column = L'\0';
          }
          msg_flag = false;
        }
        if ((__s != (char *)0x0) && (local_468 < L'ϩ')) {
          my_strcpy((char *)&w,__s,0x400);
          local_30 = &w;
          h._3_1_ = message_type_color((uint16_t)(wchar_t)msg);
          while (type + L'\xffffffff' < message_column + t._4_4_) {
            if ((type + L'\xfffffff8') - message_column < 0) {
              local_46c = L'\0';
            }
            else {
              local_46c = (type + L'\xfffffff8') - message_column;
            }
            wStack_454 = local_46c;
            local_458 = local_46c;
            do {
              if (type / 2 - message_column < 0) {
                local_474 = L'\0';
              }
              else {
                local_474 = type / 2 - message_column;
              }
              wVar2 = wStack_454;
            } while ((local_474 < local_458) &&
                    (local_458 = local_458 + L'\xffffffff', wVar2 = local_458,
                    *(char *)((long)local_30 + (long)local_458) != ' '));
            wStack_454 = wVar2;
            uVar1 = *(undefined1 *)((long)local_30 + (long)wStack_454);
            *(undefined1 *)((long)local_30 + (long)wStack_454) = 0;
            Term_putstr(message_column,L'\0',wStack_454,(uint)h._3_1_,(char *)local_30);
            msg_flush(message_column + wStack_454 + L'\x01');
            *(undefined1 *)((long)local_30 + (long)wStack_454) = uVar1;
            iVar4 = wStack_454 + L'\xffffffff';
            *(undefined1 *)((long)local_30 + (long)iVar4) = 0x20;
            local_30 = (wchar_t *)((long)local_30 + (long)iVar4);
            t._4_4_ = t._4_4_ - iVar4;
            message_column = L'\0';
          }
          Term_putstr(message_column,L'\0',t._4_4_,(uint)h._3_1_,(char *)local_30);
          msg_flag = true;
          message_column = t._4_4_ + L'\x01' + message_column;
        }
      }
    }
    else {
      Term_xtra(L'\a',L'\0');
    }
  }
  return;
}

Assistant:

void display_message(game_event_type unused, game_event_data *data, void *user)
{
	int n;
	char *t;
	char buf[1024];
	uint8_t color;
	int w, h;

	int type;
	const char *msg;

	if (!data) return;

	type = data->message.type;
	msg = data->message.msg;

	if (Term && type == MSG_BELL) {
		Term_xtra(TERM_XTRA_NOISE, 0);
		return;
	}

	if (!msg || !Term || !character_generated)
		return;

	/* Obtain the size */
	(void)Term_get_size(&w, &h);

	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Message Length */
	n = (msg ? strlen(msg) : 0);

	/* Hack -- flush when requested or needed */
	if (message_column && (!msg || ((message_column + n) > (w - 8)))) {
		/* Flush */
		if (message_column <= w - 8) {
			msg_flush(message_column);
			message_column = 0;
		} else {
			msg_flush_split_existing(w, &message_column);
		}

		/* Forget it */
		msg_flag = false;
	}

	/* No message */
	if (!msg) return;

	/* Paranoia */
	if (n > 1000) return;

	/* Copy it */
	my_strcpy(buf, msg, sizeof(buf));

	/* Analyze the buffer */
	t = buf;

	/* Get the color of the message */
	color = message_type_color(type);

	/* Split message */
	while (message_column + n > w - 1) {
		/* Default split */
		int split = MAX(w - 8 - message_column, 0);
		int check = split;
		char oops;

		/* Find the rightmost split point */
		while (check > MAX(w / 2 - message_column, 0)) {
			--check;
			if (t[check] == ' ') {
				split = check;
				break;
			}
		}

		/* Save the split character */
		oops = t[split];

		/* Split the message */
		t[split] = '\0';

		/* Display part of the message */
		Term_putstr(message_column, 0, split, color, t);

		/* Flush it */
		msg_flush(message_column + split + 1);

		/* Restore the split character */
		t[split] = oops;

		/* Insert a space */
		t[--split] = ' ';

		/* Prepare to recurse on the rest of "buf" */
		t += split; n -= split; message_column = 0;
	}

	/* Display the tail of the message */
	Term_putstr(message_column, 0, n, color, t);

	/* Remember the message */
	msg_flag = true;

	/* Remember the position */
	message_column += n + 1;
}